

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_853dad::getInputPath(string *arg,cmExecutionStatus *status,string *path)

{
  cmValue cVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  cVar1 = cmMakefile::GetDefinition(status->Makefile,arg);
  if (cVar1.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_38,"undefined variable for input path.",&local_39);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::__cxx11::string::_M_assign((string *)path);
  }
  return cVar1.Value != (string *)0x0;
}

Assistant:

bool getInputPath(const std::string& arg, cmExecutionStatus& status,
                  std::string& path)
{
  cmValue def = status.GetMakefile().GetDefinition(arg);
  if (!def) {
    status.SetError("undefined variable for input path.");
    return false;
  }

  path = *def;
  return true;
}